

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring_unittest.cc
# Opt level: O0

unique_ptr<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>_> __thiscall
google::protobuf::SingleArena::GetArena(SingleArena *this)

{
  ParamType *pPVar1;
  Arena *this_00;
  SingleArena *this_local;
  
  pPVar1 = testing::WithParamInterface<bool>::GetParam();
  if ((*pPVar1 & 1U) == 0) {
    this_00 = (Arena *)operator_new(0xa8);
    Arena::Arena(this_00);
    std::unique_ptr<google::protobuf::Arena,std::default_delete<google::protobuf::Arena>>::
    unique_ptr<std::default_delete<google::protobuf::Arena>,void>
              ((unique_ptr<google::protobuf::Arena,std::default_delete<google::protobuf::Arena>> *)
               this,this_00);
  }
  else {
    std::unique_ptr<google::protobuf::Arena,std::default_delete<google::protobuf::Arena>>::
    unique_ptr<std::default_delete<google::protobuf::Arena>,void>
              ((unique_ptr<google::protobuf::Arena,std::default_delete<google::protobuf::Arena>> *)
               this,(nullptr_t)0x0);
  }
  return (__uniq_ptr_data<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>,_true,_true>
          )(__uniq_ptr_data<google::protobuf::Arena,_std::default_delete<google::protobuf::Arena>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<Arena> GetArena() {
    if (this->GetParam()) return nullptr;
    return std::unique_ptr<Arena>(new Arena());
  }